

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears.c
# Opt level: O0

void gear(GLfloat inner_radius,GLfloat outer_radius,GLfloat width,GLint teeth,GLfloat tooth_depth)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  GLfloat len;
  GLfloat v;
  GLfloat u;
  GLfloat da;
  GLfloat angle;
  GLfloat r2;
  GLfloat r1;
  GLfloat r0;
  GLint i;
  GLfloat tooth_depth_local;
  GLint teeth_local;
  GLfloat width_local;
  GLfloat outer_radius_local;
  GLfloat inner_radius_local;
  
  fVar1 = outer_radius - tooth_depth / 2.0;
  fVar2 = outer_radius + tooth_depth / 2.0;
  fVar3 = (6.2831855 / (float)teeth) / 4.0;
  glShadeModel(0x1d00);
  glNormal3f();
  glBegin(8);
  for (r1 = 0.0; (int)r1 <= teeth; r1 = (GLfloat)((int)r1 + 1)) {
    fVar4 = ((float)(int)r1 * 2.0 * 3.1415927) / (float)teeth;
    cos((double)fVar4);
    sin((double)fVar4);
    glVertex3f();
    cos((double)fVar4);
    sin((double)fVar4);
    glVertex3f();
    if ((int)r1 < teeth) {
      cos((double)fVar4);
      sin((double)fVar4);
      glVertex3f();
      cos((double)(fVar3 * 3.0 + fVar4));
      sin((double)(fVar3 * 3.0 + fVar4));
      glVertex3f();
    }
  }
  glEnd();
  glBegin(7);
  fVar3 = (6.2831855 / (float)teeth) / 4.0;
  for (r1 = 0.0; (int)r1 < teeth; r1 = (GLfloat)((int)r1 + 1)) {
    fVar4 = ((float)(int)r1 * 2.0 * 3.1415927) / (float)teeth;
    cos((double)fVar4);
    sin((double)fVar4);
    glVertex3f();
    cos((double)(fVar4 + fVar3));
    sin((double)(fVar4 + fVar3));
    glVertex3f();
    cos((double)(fVar3 + fVar3 + fVar4));
    sin((double)(fVar3 + fVar3 + fVar4));
    glVertex3f();
    cos((double)(fVar3 * 3.0 + fVar4));
    sin((double)(fVar3 * 3.0 + fVar4));
    glVertex3f();
  }
  glEnd();
  glNormal3f();
  glBegin(8);
  for (r1 = 0.0; (int)r1 <= teeth; r1 = (GLfloat)((int)r1 + 1)) {
    fVar4 = ((float)(int)r1 * 2.0 * 3.1415927) / (float)teeth;
    cos((double)fVar4);
    sin((double)fVar4);
    glVertex3f();
    cos((double)fVar4);
    sin((double)fVar4);
    glVertex3f();
    if ((int)r1 < teeth) {
      cos((double)(fVar3 * 3.0 + fVar4));
      sin((double)(fVar3 * 3.0 + fVar4));
      glVertex3f();
      cos((double)fVar4);
      sin((double)fVar4);
      glVertex3f();
    }
  }
  glEnd();
  glBegin(7);
  fVar3 = (6.2831855 / (float)teeth) / 4.0;
  for (r1 = 0.0; (int)r1 < teeth; r1 = (GLfloat)((int)r1 + 1)) {
    fVar4 = ((float)(int)r1 * 2.0 * 3.1415927) / (float)teeth;
    cos((double)(fVar3 * 3.0 + fVar4));
    sin((double)(fVar3 * 3.0 + fVar4));
    glVertex3f();
    cos((double)(fVar3 + fVar3 + fVar4));
    sin((double)(fVar3 + fVar3 + fVar4));
    glVertex3f();
    cos((double)(fVar4 + fVar3));
    sin((double)(fVar4 + fVar3));
    glVertex3f();
    cos((double)fVar4);
    sin((double)fVar4);
    glVertex3f();
  }
  glEnd();
  glBegin(8);
  for (r1 = 0.0; (int)r1 < teeth; r1 = (GLfloat)((int)r1 + 1)) {
    fVar4 = ((float)(int)r1 * 2.0 * 3.1415927) / (float)teeth;
    cos((double)fVar4);
    sin((double)fVar4);
    glVertex3f();
    cos((double)fVar4);
    sin((double)fVar4);
    glVertex3f();
    dVar7 = cos((double)(fVar4 + fVar3));
    dVar8 = cos((double)fVar4);
    fVar5 = fVar2 * (float)dVar7 + -(fVar1 * (float)dVar8);
    dVar7 = sin((double)(fVar4 + fVar3));
    dVar8 = sin((double)fVar4);
    fVar6 = fVar2 * (float)dVar7 + -(fVar1 * (float)dVar8);
    sqrt((double)(fVar5 * fVar5 + fVar6 * fVar6));
    glNormal3f();
    cos((double)(fVar4 + fVar3));
    sin((double)(fVar4 + fVar3));
    glVertex3f();
    cos((double)(fVar4 + fVar3));
    sin((double)(fVar4 + fVar3));
    glVertex3f();
    cos((double)fVar4);
    sin((double)fVar4);
    glNormal3f();
    cos((double)(fVar3 + fVar3 + fVar4));
    sin((double)(fVar3 + fVar3 + fVar4));
    glVertex3f();
    cos((double)(fVar3 + fVar3 + fVar4));
    sin((double)(fVar3 + fVar3 + fVar4));
    glVertex3f();
    cos((double)(fVar3 * 3.0 + fVar4));
    cos((double)(fVar3 + fVar3 + fVar4));
    sin((double)(fVar3 * 3.0 + fVar4));
    sin((double)(fVar3 + fVar3 + fVar4));
    glNormal3f();
    cos((double)(fVar3 * 3.0 + fVar4));
    sin((double)(fVar3 * 3.0 + fVar4));
    glVertex3f();
    cos((double)(fVar3 * 3.0 + fVar4));
    sin((double)(fVar3 * 3.0 + fVar4));
    glVertex3f();
    cos((double)fVar4);
    sin((double)fVar4);
    glNormal3f();
  }
  cos(0.0);
  sin(0.0);
  glVertex3f();
  cos(0.0);
  sin(0.0);
  glVertex3f();
  glEnd();
  glShadeModel(0x1d01);
  glBegin(8);
  for (r1 = 0.0; (int)r1 <= teeth; r1 = (GLfloat)((int)r1 + 1)) {
    fVar1 = ((float)(int)r1 * 2.0 * 3.1415927) / (float)teeth;
    cos((double)fVar1);
    sin((double)fVar1);
    glNormal3f();
    cos((double)fVar1);
    sin((double)fVar1);
    glVertex3f();
    cos((double)fVar1);
    sin((double)fVar1);
    glVertex3f();
  }
  glEnd();
  return;
}

Assistant:

static void
gear(GLfloat inner_radius, GLfloat outer_radius, GLfloat width,
  GLint teeth, GLfloat tooth_depth)
{
  GLint i;
  GLfloat r0, r1, r2;
  GLfloat angle, da;
  GLfloat u, v, len;

  r0 = inner_radius;
  r1 = outer_radius - tooth_depth / 2.f;
  r2 = outer_radius + tooth_depth / 2.f;

  da = 2.f * (float) M_PI / teeth / 4.f;

  glShadeModel(GL_FLAT);

  glNormal3f(0.f, 0.f, 1.f);

  /* draw front face */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i <= teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), width * 0.5f);
    if (i < teeth) {
      glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), width * 0.5f);
      glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), width * 0.5f);
    }
  }
  glEnd();

  /* draw front sides of teeth */
  glBegin(GL_QUADS);
  da = 2.f * (float) M_PI / teeth / 4.f;
  for (i = 0; i < teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;

    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), width * 0.5f);
  }
  glEnd();

  glNormal3f(0.0, 0.0, -1.0);

  /* draw back face */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i <= teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), -width * 0.5f);
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), -width * 0.5f);
    if (i < teeth) {
      glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), -width * 0.5f);
      glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), -width * 0.5f);
    }
  }
  glEnd();

  /* draw back sides of teeth */
  glBegin(GL_QUADS);
  da = 2.f * (float) M_PI / teeth / 4.f;
  for (i = 0; i < teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;

    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), -width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), -width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), -width * 0.5f);
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), -width * 0.5f);
  }
  glEnd();

  /* draw outward faces of teeth */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i < teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;

    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), -width * 0.5f);
    u = r2 * (float) cos(angle + da) - r1 * (float) cos(angle);
    v = r2 * (float) sin(angle + da) - r1 * (float) sin(angle);
    len = (float) sqrt(u * u + v * v);
    u /= len;
    v /= len;
    glNormal3f(v, -u, 0.0);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), -width * 0.5f);
    glNormal3f((float) cos(angle), (float) sin(angle), 0.f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), -width * 0.5f);
    u = r1 * (float) cos(angle + 3 * da) - r2 * (float) cos(angle + 2 * da);
    v = r1 * (float) sin(angle + 3 * da) - r2 * (float) sin(angle + 2 * da);
    glNormal3f(v, -u, 0.f);
    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), -width * 0.5f);
    glNormal3f((float) cos(angle), (float) sin(angle), 0.f);
  }

  glVertex3f(r1 * (float) cos(0), r1 * (float) sin(0), width * 0.5f);
  glVertex3f(r1 * (float) cos(0), r1 * (float) sin(0), -width * 0.5f);

  glEnd();

  glShadeModel(GL_SMOOTH);

  /* draw inside radius cylinder */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i <= teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;
    glNormal3f(-(float) cos(angle), -(float) sin(angle), 0.f);
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), -width * 0.5f);
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), width * 0.5f);
  }
  glEnd();

}